

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-chat.cpp
# Opt level: O2

void assert_msg_equals(common_chat_msg *expected,common_chat_msg *actual)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  data local_d8;
  _Any_data local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  string_t local_80;
  string_t local_60;
  data local_40;
  
  assert_equals<std::__cxx11::string>(&expected->role,&actual->role);
  assert_equals<std::__cxx11::string>(&expected->content,&actual->content);
  local_80._M_dataplus._M_p =
       (pointer)((long)(expected->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(expected->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
  local_60._M_dataplus._M_p =
       (pointer)((long)(actual->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(actual->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
  assert_equals<unsigned_long>((unsigned_long *)&local_80,(unsigned_long *)&local_60);
  lVar5 = 0;
  for (uVar6 = 0;
      pcVar1 = (expected->content_parts).
               super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(expected->content_parts).
                            super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 6);
      uVar6 = uVar6 + 1) {
    pcVar2 = (actual->content_parts).
             super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
             ._M_impl.super__Vector_impl_data._M_start;
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar1->type)._M_dataplus._M_p + lVar5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar2->type)._M_dataplus._M_p + lVar5));
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar1->text)._M_dataplus._M_p + lVar5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar2->text)._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + 0x40;
  }
  assert_equals<std::__cxx11::string>(&expected->reasoning_content,&actual->reasoning_content);
  local_80._M_dataplus._M_p =
       (pointer)(((long)(expected->tool_calls).
                        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(expected->tool_calls).
                       super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  local_60._M_dataplus._M_p =
       (pointer)(((long)(actual->tool_calls).
                        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(actual->tool_calls).
                       super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  assert_equals<unsigned_long>((unsigned_long *)&local_80,(unsigned_long *)&local_60);
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pcVar3 = (expected->tool_calls).
             super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(expected->tool_calls).
                       super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) / 0x60) <= uVar6)
    break;
    pcVar4 = (actual->tool_calls).
             super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>.
             _M_impl.super__Vector_impl_data._M_start;
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar3->name)._M_dataplus._M_p + lVar5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar4->name)._M_dataplus._M_p + lVar5));
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_98 = 0;
    uStack_90 = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar3->arguments)._M_dataplus._M_p + lVar5),(parser_callback_t *)&local_a8,
               true,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(&local_80,
           (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)&local_40,-1,' ',false,strict);
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar4->arguments)._M_dataplus._M_p + lVar5),(parser_callback_t *)&local_c8,
               true,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(&local_60,
           (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)&local_d8,-1,' ',false,strict);
    assert_equals<std::__cxx11::string>(&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    std::__cxx11::string::~string((string *)&local_80);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar3->id)._M_dataplus._M_p + lVar5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pcVar4->id)._M_dataplus._M_p + lVar5));
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x60;
  }
  return;
}

Assistant:

static void assert_msg_equals(const common_chat_msg & expected, const common_chat_msg & actual) {
    assert_equals(expected.role, actual.role);
    assert_equals(expected.content, actual.content);
    assert_equals(expected.content_parts.size(), actual.content_parts.size());
    for (size_t i = 0; i < expected.content_parts.size(); i++) {
        const auto & expected_part = expected.content_parts[i];
        const auto & actual_part   = actual.content_parts[i];
        assert_equals(expected_part.type, actual_part.type);
        assert_equals(expected_part.text, actual_part.text);
    }
    assert_equals(expected.reasoning_content, actual.reasoning_content);
    assert_equals(expected.tool_calls.size(), actual.tool_calls.size());
    for (size_t i = 0; i < expected.tool_calls.size(); i++) {
        const auto & expected_tool_call = expected.tool_calls[i];
        const auto & actual_tool_call   = actual.tool_calls[i];
        assert_equals(expected_tool_call.name, actual_tool_call.name);
        assert_equals(json::parse(expected_tool_call.arguments).dump(), json::parse(actual_tool_call.arguments).dump());
        assert_equals(expected_tool_call.id, actual_tool_call.id);
    }
}